

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFunctionBlocker.h
# Opt level: O2

void __thiscall cmFunctionBlocker::~cmFunctionBlocker(cmFunctionBlocker *this)

{
  this->_vptr_cmFunctionBlocker = (_func_int **)&PTR__cmFunctionBlocker_0089eb90;
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector(&this->Functions);
  cmListFileContext::~cmListFileContext(&this->StartingContext);
  return;
}

Assistant:

virtual ~cmFunctionBlocker() = default;